

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatRead.c
# Opt level: O2

int Msat_SolverParseDimacs(FILE *pFile,Msat_Solver_t **p,int fVerbose)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  byte *__ptr;
  Msat_Solver_t *p_00;
  Msat_IntVec_t *p_01;
  byte *local_48;
  int local_3c;
  Msat_Solver_t **local_38;
  
  p_01 = (Msat_IntVec_t *)0x0;
  local_3c = fVerbose;
  local_38 = p;
  fseek((FILE *)pFile,0,2);
  lVar6 = ftell((FILE *)pFile);
  rewind((FILE *)pFile);
  __ptr = (byte *)malloc((lVar6 << 0x20) + 0x300000000 >> 0x20);
  fread(__ptr,(long)(int)lVar6,1,(FILE *)pFile);
  __ptr[(int)lVar6] = 10;
  __ptr[(lVar6 << 0x20) + 0x100000000 >> 0x20] = 0;
  p_00 = (Msat_Solver_t *)0x0;
  local_48 = __ptr;
  do {
    while( true ) {
      while( true ) {
        Msat_ReadWhitespace((char **)&local_48);
        bVar1 = *local_48;
        if (bVar1 != 99) break;
        skipLine((char **)&local_48);
      }
      if (bVar1 == 0) {
        Msat_IntVecFree(p_01);
        *local_38 = p_00;
        iVar5 = Msat_SolverSimplifyDB(p_00);
        goto LAB_0043d4c1;
      }
      if (bVar1 != 0x70) break;
      local_48 = local_48 + 1;
      Msat_ReadWhitespace((char **)&local_48);
      while ((0x20 < (ulong)*local_48 || ((0x100003e00U >> ((ulong)*local_48 & 0x3f) & 1) == 0))) {
        local_48 = local_48 + 1;
      }
      iVar5 = Msat_ReadInt((char **)&local_48);
      Msat_ReadInt((char **)&local_48);
      skipLine((char **)&local_48);
      p_00 = Msat_SolverAlloc(iVar5,1.0,1.0,1.0,1.0,0);
      Msat_SolverClean(p_00,iVar5);
      Msat_SolverSetVerbosity(p_00,local_3c);
      p_01 = Msat_IntVecAlloc(iVar5);
    }
    if (p_00 == (Msat_Solver_t *)0x0) {
      puts("There is no parameter line.");
LAB_0043d4ea:
      exit(1);
    }
    uVar3 = Msat_SolverReadVarNum(p_00);
    Msat_IntVecClear(p_01);
    while( true ) {
      uVar4 = Msat_ReadInt((char **)&local_48);
      if (uVar4 == 0) break;
      uVar2 = -uVar4;
      if (0 < (int)uVar4) {
        uVar2 = uVar4;
      }
      if ((int)uVar3 < (int)uVar2) {
        printf("Variable %d is larger than the number of allocated variables (%d).\n",(ulong)uVar2,
               (ulong)uVar3);
        goto LAB_0043d4ea;
      }
      Msat_IntVecPush(p_01,(uint)((int)uVar4 < 1) + uVar2 * 2 + -2);
    }
    iVar5 = Msat_SolverAddClause(p_00,p_01);
  } while (iVar5 != 0);
  iVar5 = 0;
LAB_0043d4c1:
  free(__ptr);
  return iVar5;
}

Assistant:

int  Msat_SolverParseDimacs( FILE * pFile, Msat_Solver_t ** p, int fVerbose )
{
    char * pText;
    int  Value;
    pText = Msat_FileRead( pFile );
    Value = Msat_ReadDimacs( pText, p, fVerbose );
    ABC_FREE( pText );
    return Value;
}